

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O3

void duckdb::
     LeastGreatestFunction<signed_char,duckdb::GreaterThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  reference pvVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_type sVar9;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  long *local_880;
  long local_878;
  long local_870;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_860;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_840;
  bool local_838 [2056];
  
  if (*(long *)(args + 8) - *(long *)args == 0x68) {
    vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,0);
    duckdb::Vector::Reference(result);
    return;
  }
  if (*(long *)(args + 8) == *(long *)args) {
    memset(local_838,0,0x800);
  }
  else {
    sVar9 = 0;
    do {
      vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)args,sVar9);
      sVar9 = sVar9 + 1;
      lVar2 = *(long *)args;
      lVar3 = *(long *)(args + 8);
    } while (sVar9 < (ulong)((lVar3 - lVar2 >> 3) * 0x4ec4ec4ec4ec4ec5));
    lVar4 = *(long *)(result + 0x20);
    memset(local_838,0,0x800);
    if (lVar3 != lVar2) {
      sVar9 = 0;
      do {
        pvVar5 = vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)args,sVar9);
        if (*pvVar5 == (value_type)0x2) {
          pvVar5 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)args,sVar9);
          if ((*(byte **)(pvVar5 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar5 + 0x28) & 1) != 0))
          goto LAB_00673bb4;
        }
        else {
LAB_00673bb4:
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_880);
          pvVar5 = vector<duckdb::Vector,_true>::operator[]
                             ((vector<duckdb::Vector,_true> *)args,sVar9);
          duckdb::Vector::ToUnifiedFormat((ulong)pvVar5,*(UnifiedVectorFormat **)(args + 0x18));
          uVar6 = *(ulong *)(args + 0x18);
          if (local_870 == 0) {
            if (uVar6 != 0) {
              uVar7 = 0;
              do {
                uVar8 = uVar7;
                if (*local_880 != 0) {
                  uVar8 = (ulong)*(uint *)(*local_880 + uVar7 * 4);
                }
                cVar1 = *(char *)(local_878 + uVar8);
                if ((local_838[uVar7] != true) || (*(char *)(lVar4 + uVar7) < cVar1)) {
                  local_838[uVar7] = true;
                  *(char *)(lVar4 + uVar7) = cVar1;
                  uVar6 = *(ulong *)(args + 0x18);
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 < uVar6);
            }
          }
          else if (uVar6 != 0) {
            uVar7 = 0;
            do {
              uVar8 = uVar7;
              if (*local_880 != 0) {
                uVar8 = (ulong)*(uint *)(*local_880 + uVar7 * 4);
              }
              if (((local_870 == 0) ||
                  ((*(ulong *)(local_870 + (uVar8 >> 6) * 8) >> (uVar8 & 0x3f) & 1) != 0)) &&
                 ((cVar1 = *(char *)(local_878 + uVar8), local_838[uVar7] != true ||
                  (*(char *)(lVar4 + uVar7) < cVar1)))) {
                local_838[uVar7] = true;
                *(char *)(lVar4 + uVar7) = cVar1;
                uVar6 = *(ulong *)(args + 0x18);
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < uVar6);
          }
          if (local_840 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_840);
          }
          if (local_860 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_860);
          }
        }
        sVar9 = sVar9 + 1;
      } while (sVar9 < (ulong)((*(long *)(args + 8) - *(long *)args >> 3) * 0x4ec4ec4ec4ec4ec5));
    }
  }
  StandardLeastGreatest<false>::FinalizeResult(*(idx_t *)(args + 0x18),local_838,result,state);
  duckdb::Vector::SetVectorType((VectorType)result);
  return;
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}